

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O3

void initialize_imputer<InputData<double,int>,double>
               (Imputer *imputer,InputData<double,_int> *input_data,size_t ntrees,int nthreads)

{
  vector<double,_std::allocator<double>_> *this;
  int iVar1;
  pointer pdVar2;
  pointer pdVar3;
  double *pdVar4;
  int *piVar5;
  pointer piVar6;
  pointer pIVar7;
  pointer __s;
  pointer pvVar8;
  ulong uVar9;
  undefined4 in_register_0000000c;
  long lVar10;
  long lVar11;
  pointer *ppIVar12;
  ulong uVar13;
  pointer pIVar14;
  long lVar15;
  pointer *ppIVar16;
  ulong uVar17;
  size_t sVar18;
  size_t sVar19;
  size_t sVar20;
  bool bVar21;
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  double dVar25;
  vector<unsigned_long,_std::allocator<unsigned_long>_> cat_counts;
  allocator_type local_89;
  vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  local_88;
  pointer *local_68;
  size_t local_60;
  int *local_58;
  int *local_50;
  vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  local_48;
  
  imputer->ncols_numeric = input_data->ncols_numeric;
  sVar18 = input_data->ncols_categ;
  imputer->ncols_categ = sVar18;
  std::vector<int,std::allocator<int>>::_M_assign_aux<int*>
            ((vector<int,std::allocator<int>> *)&imputer->ncat,input_data->ncat,
             input_data->ncat + sVar18,CONCAT44(in_register_0000000c,nthreads));
  this = &imputer->col_means;
  if ((imputer->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (imputer->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_88.
    super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::resize
              (this,input_data->ncols_numeric,(value_type_conflict *)&local_88);
  }
  else {
    std::vector<double,_std::allocator<double>_>::resize(this,input_data->ncols_numeric);
    pdVar2 = (imputer->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (imputer->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pdVar2 != pdVar3) {
      memset(pdVar2,0,((long)pdVar3 + (-8 - (long)pdVar2) & 0xfffffffffffffff8U) + 8);
    }
  }
  std::vector<int,_std::allocator<int>_>::resize(&imputer->col_modes,input_data->ncols_categ);
  std::
  vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  ::vector(&local_48,ntrees,&local_89);
  local_88.
  super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (imputer->imputer_tree).
       super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (imputer->imputer_tree).
  super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_48.
       super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_88.
  super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (imputer->imputer_tree).
       super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_88.
  super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (imputer->imputer_tree).
       super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (imputer->imputer_tree).
  super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_48.
       super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (imputer->imputer_tree).
  super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_48.
       super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_48.
  super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  ::~vector(&local_88);
  std::
  vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  ::~vector(&local_48);
  pdVar4 = input_data->numeric_data;
  if (pdVar4 == (double *)0x0) {
    piVar5 = input_data->Xc_indptr;
    if ((piVar5 != (int *)0x0) && (input_data->ncols_numeric != 0)) {
      uVar17 = 0;
      do {
        sVar18 = input_data->nrows;
        lVar10 = (long)piVar5[uVar17];
        iVar1 = piVar5[uVar17 + 1];
        pdVar2 = (this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (piVar5[uVar17] < iVar1) {
          pdVar4 = input_data->Xc;
          dVar22 = pdVar2[uVar17];
          do {
            dVar25 = pdVar4[lVar10];
            if (0x7fefffffffffffff < (ulong)ABS(dVar25)) {
              dVar25 = 0.0;
            }
            dVar22 = dVar22 + dVar25;
            pdVar2[uVar17] = dVar22;
            sVar18 = sVar18 - (0x7fefffffffffffff < (ulong)ABS(pdVar4[lVar10]));
            lVar10 = lVar10 + 1;
          } while (iVar1 != lVar10);
        }
        else {
          dVar22 = pdVar2[uVar17];
        }
        auVar24._8_4_ = (int)(sVar18 >> 0x20);
        auVar24._0_8_ = sVar18;
        auVar24._12_4_ = 0x45300000;
        dVar25 = NAN;
        if (sVar18 != 0) {
          dVar25 = dVar22 / ((auVar24._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)sVar18) - 4503599627370496.0));
        }
        pdVar2[uVar17] = dVar25;
        uVar17 = uVar17 + 1;
      } while (uVar17 < input_data->ncols_numeric);
    }
  }
  else if (input_data->ncols_numeric != 0) {
    lVar10 = 0;
    uVar17 = 0;
    do {
      sVar18 = input_data->nrows;
      pdVar2 = (this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start + uVar17;
      if (sVar18 == 0) {
LAB_0015c1fa:
        dVar22 = NAN;
      }
      else {
        dVar22 = *pdVar2;
        sVar20 = 0;
        sVar19 = sVar18;
        do {
          dVar25 = *(double *)((long)pdVar4 + sVar20 * 8 + sVar18 * lVar10);
          if (0x7fefffffffffffff < (ulong)ABS(dVar25)) {
            dVar25 = 0.0;
          }
          dVar22 = dVar22 + dVar25;
          *pdVar2 = dVar22;
          sVar19 = sVar19 - (0x7fefffffffffffff <
                            (*(ulong *)((long)pdVar4 + sVar20 * 8 + sVar18 * lVar10) &
                            0x7fffffffffffffff));
          sVar20 = sVar20 + 1;
        } while (sVar18 != sVar20);
        auVar23._8_4_ = (int)(sVar19 >> 0x20);
        auVar23._0_8_ = sVar19;
        auVar23._12_4_ = 0x45300000;
        if (sVar19 == 0) goto LAB_0015c1fa;
        dVar22 = dVar22 / ((auVar23._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)sVar19) - 4503599627370496.0));
      }
      *pdVar2 = dVar22;
      uVar17 = uVar17 + 1;
      lVar10 = lVar10 + 8;
    } while (uVar17 < input_data->ncols_numeric);
  }
  if (input_data->categ_data != (int *)0x0) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_88,
               (long)input_data->max_categ,(allocator_type *)&local_48);
    pvVar8 = local_88.
             super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    __s = local_88.
          super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    if (input_data->ncols_categ != 0) {
      local_58 = input_data->categ_data;
      local_50 = input_data->ncat;
      local_68 = &((local_88.
                    super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                  super__Vector_base<ImputeNode,_std::allocator<ImputeNode>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
      piVar6 = (imputer->col_modes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_60 = ((long)local_88.
                        super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish +
                  (-8 - (long)local_88.
                              super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) & 0xfffffffffffffff8U) + 8;
      lVar10 = 0;
      uVar17 = 0;
      do {
        if (__s != pvVar8) {
          memset(__s,0,local_60);
        }
        uVar9 = input_data->nrows;
        if (uVar9 != 0) {
          lVar11 = uVar9 * lVar10;
          uVar13 = 0;
          do {
            lVar15 = (long)*(int *)((long)local_58 + uVar13 * 4 + lVar11);
            if (-1 < lVar15) {
              ppIVar12 = &(__s->super__Vector_base<ImputeNode,_std::allocator<ImputeNode>_>)._M_impl
                          .super__Vector_impl_data._M_start + lVar15;
              *ppIVar12 = (pointer)((long)&((*ppIVar12)->num_sum).
                                           super__Vector_base<double,_std::allocator<double>_> + 1);
              uVar9 = input_data->nrows;
            }
            uVar13 = uVar13 + 1;
          } while (uVar13 < uVar9);
        }
        ppIVar12 = (pointer *)__s;
        if (1 < (ulong)(long)local_50[uVar17]) {
          pIVar14 = (__s->super__Vector_base<ImputeNode,_std::allocator<ImputeNode>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          lVar11 = (long)local_50[uVar17] * 8 + -8;
          ppIVar16 = local_68;
          do {
            pIVar7 = *ppIVar16;
            bVar21 = pIVar14 < pIVar7;
            if (pIVar14 <= pIVar7) {
              pIVar14 = pIVar7;
            }
            if (bVar21) {
              ppIVar12 = ppIVar16;
            }
            ppIVar16 = ppIVar16 + 1;
            lVar11 = lVar11 + -8;
          } while (lVar11 != 0);
        }
        piVar6[uVar17] = (int)((ulong)((long)ppIVar12 - (long)__s) >> 3);
        uVar17 = uVar17 + 1;
        lVar10 = lVar10 + 4;
      } while (uVar17 < input_data->ncols_categ);
    }
    if (local_88.
        super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88.
                      super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_88.
                            super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.
                            super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void initialize_imputer(Imputer &imputer, InputData &input_data, size_t ntrees, int nthreads)
{
    imputer.ncols_numeric  =  input_data.ncols_numeric;
    imputer.ncols_categ    =  input_data.ncols_categ;
    imputer.ncat.assign(input_data.ncat, input_data.ncat + input_data.ncols_categ);
    if (imputer.col_means.size())
    {
        imputer.col_means.resize(input_data.ncols_numeric);
        std::fill(imputer.col_means.begin(), imputer.col_means.end(), 0);
    }

    else
    {
        imputer.col_means.resize(input_data.ncols_numeric, 0);
    }

    imputer.col_modes.resize(input_data.ncols_categ);
    imputer.imputer_tree = std::vector<std::vector<ImputeNode>>(ntrees);

    /* TODO: here should use sample weights if specified as density */
    size_t offset, cnt;
    if (input_data.numeric_data != NULL)
    {
        #pragma omp parallel for schedule(static) num_threads(nthreads) private(cnt, offset) shared(input_data, imputer)
        for (size_t_for col = 0; col < (decltype(col))input_data.ncols_numeric; col++)
        {
            cnt    = input_data.nrows;
            offset = col * input_data.nrows;
            for (size_t row = 0; row < input_data.nrows; row++)
            {
                imputer.col_means[col] += (!is_na_or_inf(input_data.numeric_data[row + offset]))?
                                           input_data.numeric_data[row + offset] : 0;
                cnt -= is_na_or_inf(input_data.numeric_data[row + offset]);
            }
            imputer.col_means[col] /= (ldouble_safe) cnt;
            if (!cnt) imputer.col_means[col] = NAN;
        }
    }

    else if (input_data.Xc_indptr != NULL)
    {
        #pragma omp parallel for schedule(dynamic) num_threads(nthreads) private(cnt) shared(input_data, imputer)
        for (size_t_for col = 0; col < (decltype(col))input_data.ncols_numeric; col++)
        {
            cnt = input_data.nrows;
            for (auto ix = input_data.Xc_indptr[col]; ix < input_data.Xc_indptr[col + 1]; ix++)
            {
                imputer.col_means[col] += (!is_na_or_inf(input_data.Xc[ix]))?
                                           input_data.Xc[ix] : 0;
                cnt -= is_na_or_inf(input_data.Xc[ix]);
            }
            imputer.col_means[col] /= (ldouble_safe) cnt;
            if (!cnt) imputer.col_means[col] = NAN;
        }
    }

    if (input_data.categ_data != NULL)
    {
        std::vector<size_t> cat_counts(input_data.max_categ);
        #pragma omp parallel for schedule(static) num_threads(nthreads) firstprivate(cat_counts) private(offset) shared(input_data, imputer)
        for (size_t_for col = 0; col < (decltype(col))input_data.ncols_categ; col++)
        {
            std::fill(cat_counts.begin(), cat_counts.end(), 0);
            offset = col * input_data.nrows;
            for (size_t row = 0; row < input_data.nrows; row++)
            {
                if (input_data.categ_data[row + offset] >= 0)
                    cat_counts[input_data.categ_data[row + offset]]++;
            }
            imputer.col_modes[col] = (int) std::distance(cat_counts.begin(),
                                                         std::max_element(cat_counts.begin(),
                                                                           cat_counts.begin() + input_data.ncat[col]));
        }
    }
}